

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_MfsStop(Acb_Mfs_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  pVVar1 = p->vFlip;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSupp;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vValues;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  sat_solver_delete(p->pSat[0]);
  sat_solver_delete(p->pSat[1]);
  sat_solver_delete(p->pSat[2]);
  free(p);
  return;
}

Assistant:

void Acb_MfsStop( Acb_Mfs_t * p )
{
    Vec_IntFree( p->vFlip );
    Vec_IntFree( p->vSupp );
    Vec_IntFree( p->vValues );
    sat_solver_delete( p->pSat[0] );
    sat_solver_delete( p->pSat[1] );
    sat_solver_delete( p->pSat[2] );
    ABC_FREE( p );
}